

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O3

void __thiscall
gl3cts::TextureSizePromotion::FunctionalTest::prepareSourceTexture
          (FunctionalTest *this,TextureInternalFormatDescriptor descriptor,GLenum target)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined8 uVar4;
  undefined4 *puVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x6f8))(1,&this->m_source_texture);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGetTexLevelParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0xe9);
  (**(code **)(lVar3 + 0xb8))(target,this->m_source_texture);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGetTexLevelParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0xec);
  puVar6 = (undefined1 *)0x1406;
  uVar4 = 0x1908;
  if ((descriptor.expected_alpha_type == 0x1406 || descriptor.expected_blue_type == 0x1406) ||
      (descriptor.expected_green_type == 0x1406 || descriptor.expected_red_type == 0x1406)) {
    puVar7 = s_source_texture_data_f;
  }
  else if ((descriptor.expected_alpha_type == 0x8f9c || descriptor.expected_blue_type == 0x8f9c) ||
           (descriptor.expected_green_type == 0x8f9c || descriptor.expected_red_type == 0x8f9c)) {
    puVar7 = s_source_texture_data_sn;
  }
  else if ((descriptor.expected_alpha_type == 0x8c17 || descriptor.expected_blue_type == 0x8c17) ||
           (descriptor.expected_green_type == 0x8c17 || descriptor.expected_red_type == 0x8c17)) {
    puVar7 = s_source_texture_data_n;
  }
  else {
    puVar6 = (undefined1 *)0x1404;
    uVar4 = 0x8d99;
    if ((descriptor.expected_alpha_type == 0x1404 || descriptor.expected_blue_type == 0x1404) ||
        (descriptor.expected_green_type == 0x1404 || descriptor.expected_red_type == 0x1404)) {
      puVar7 = s_source_texture_data_i;
    }
    else {
      puVar6 = (undefined1 *)0x1405;
      if ((descriptor.expected_alpha_type == 0x1405 || descriptor.expected_blue_type == 0x1405) ||
          (descriptor.expected_green_type == 0x1405 || descriptor.expected_red_type == 0x1405)) {
        puVar7 = s_source_texture_data_ui;
      }
      else {
        puVar7 = (undefined1 *)0x0;
        if (descriptor.expected_depth_type == 0) {
          puVar6 = (undefined1 *)0x1405;
          if (descriptor.min_stencil_size < 1) {
            puVar6 = puVar7;
          }
          uVar4 = 0x1908;
          if (0 < descriptor.min_stencil_size) {
            uVar4 = 0x1901;
          }
        }
        else {
          uVar4 = 0x1902;
        }
      }
    }
  }
  if ((int)target < 0x8c18) {
    if ((int)target < 0x806f) {
      if (target == 0xde0) {
        (**(code **)(lVar3 + 0x1308))(0xde0,0,descriptor.internal_format,1,0,uVar4,puVar6,puVar7);
        dVar2 = (**(code **)(lVar3 + 0x800))();
        iVar1 = 0x136;
        goto LAB_00846b39;
      }
      if (target != 0xde1) goto LAB_00846b4c;
    }
    else {
      if (target == 0x806f) {
LAB_00846ab3:
        (**(code **)(lVar3 + 0x1320))
                  (target,0,descriptor.internal_format,1,1,1,0,uVar4,puVar6,puVar7);
        dVar2 = (**(code **)(lVar3 + 0x800))();
        iVar1 = 0x143;
        goto LAB_00846b39;
      }
      if (target != 0x84f5) goto LAB_00846b4c;
    }
  }
  else {
    if (0x90ff < (int)target) {
      if ((target == 0x9100) || (target == 0x9102)) {
        renderDataIntoMultisampledTexture(this,descriptor,target);
        return;
      }
LAB_00846b4c:
      puVar5 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar5 = 0;
      __cxa_throw(puVar5,&int::typeinfo,0);
    }
    if (target != 0x8c18) {
      if (target != 0x8c1a) goto LAB_00846b4c;
      goto LAB_00846ab3;
    }
  }
  (**(code **)(lVar3 + 0x1310))(target,0,descriptor.internal_format,1,1,0,uVar4,puVar6,puVar7);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  iVar1 = 0x13d;
LAB_00846b39:
  glu::checkError(dVar2,"glGetTexLevelParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,iVar1);
  return;
}

Assistant:

void FunctionalTest::prepareSourceTexture(TextureInternalFormatDescriptor descriptor, glw::GLenum target)
{
	/* GL functions object. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create and bind texture object. */
	gl.genTextures(1, &m_source_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

	gl.bindTexture(target, m_source_texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");

	/* Select proper data set. */
	glw::GLvoid* source_data   = DE_NULL;
	glw::GLenum  source_type   = GL_NONE;
	glw::GLenum  source_format = GL_RGBA;

	if (isFloatType(descriptor)) /* For floating type. */
	{
		source_data   = (glw::GLvoid*)s_source_texture_data_f;
		source_type   = GL_FLOAT;
		source_format = GL_RGBA;
	}
	else
	{
		if (isFixedSignedType(descriptor)) /* For fixed signed type. */
		{
			source_data   = (glw::GLvoid*)s_source_texture_data_sn;
			source_type   = GL_FLOAT;
			source_format = GL_RGBA;
		}
		else
		{
			if (isFixedUnsignedType(descriptor)) /* For fixed unsigned type. */
			{
				source_data   = (glw::GLvoid*)s_source_texture_data_n;
				source_type   = GL_FLOAT;
				source_format = GL_RGBA;
			}
			else
			{
				if (isIntegerSignedType(descriptor)) /* For integral signed type. */
				{
					source_data   = (glw::GLvoid*)s_source_texture_data_i;
					source_type   = GL_INT;
					source_format = GL_RGBA_INTEGER;
				}
				else
				{
					if (isIntegerUnsignedType(descriptor)) /* For integral unsigned type. */
					{
						source_data   = (glw::GLvoid*)s_source_texture_data_ui;
						source_type   = GL_UNSIGNED_INT;
						source_format = GL_RGBA_INTEGER;
					}
					else
					{
						if (isDepthType(descriptor)) /* For depth type. */
						{
							source_data   = NULL;
							source_type   = GL_UNSIGNED_INT;
							source_format = GL_DEPTH_COMPONENT;
						}
						else
						{
							if (isStencilType(descriptor)) /* For stencil type. */
							{
								source_data   = NULL;
								source_type   = GL_UNSIGNED_INT;
								source_format = GL_STENCIL_INDEX;
							}
						}
					}
				}
			}
		}
	}

	/* Prepare texture storage depending on the target. */
	switch (target)
	{
	case GL_TEXTURE_1D:
		gl.texImage1D(target, 0, descriptor.internal_format, s_source_texture_size, 0, source_format, source_type,
					  source_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");
		break;
	case GL_TEXTURE_1D_ARRAY:
	case GL_TEXTURE_2D:
	case GL_TEXTURE_RECTANGLE:
		gl.texImage2D(target, 0, descriptor.internal_format, s_source_texture_size, s_source_texture_size, 0,
					  source_format, source_type, source_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");
		break;
	case GL_TEXTURE_2D_ARRAY:
	case GL_TEXTURE_3D:
		gl.texImage3D(target, 0, descriptor.internal_format, s_source_texture_size, s_source_texture_size,
					  s_source_texture_size, 0, source_format, source_type, source_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv have failed");
		break;
	case GL_TEXTURE_2D_MULTISAMPLE:
	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		renderDataIntoMultisampledTexture(descriptor, target);
		break;
	default:
		throw 0;
	}
}